

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::LongNameHandler::multiSimpleFormatsToModifiers
          (LongNameHandler *this,UnicodeString *leadFormats,UnicodeString *trailFormat,Field field,
          UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  Parameters local_1d8;
  SimpleModifier local_1c8;
  undefined1 local_158 [8];
  SimpleFormatter compoundCompiled;
  UnicodeString compoundFormat;
  UnicodeString leadFormat;
  Form plural;
  int32_t i;
  undefined1 local_78 [8];
  SimpleFormatter trailCompiled;
  UErrorCode *status_local;
  Field field_local;
  UnicodeString *trailFormat_local;
  UnicodeString *leadFormats_local;
  LongNameHandler *this_local;
  
  trailCompiled.compiledPattern.fUnion._48_8_ = status;
  SimpleFormatter::SimpleFormatter((SimpleFormatter *)local_78,trailFormat,1,1,status);
  UVar2 = ::U_FAILURE(*(UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_);
  if (UVar2 == '\0') {
    for (leadFormat.fUnion._52_4_ = 0; (int)leadFormat.fUnion._52_4_ < 6;
        leadFormat.fUnion._52_4_ = leadFormat.fUnion._52_4_ + 1) {
      anon_unknown.dwarf_15c527::getWithPlural
                ((UnicodeString *)((long)&compoundFormat.fUnion + 0x30),leadFormats,
                 leadFormat.fUnion._52_4_,(UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_)
      ;
      UVar2 = ::U_FAILURE(*(UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_);
      if (UVar2 == '\0') {
        icu_63::UnicodeString::UnicodeString
                  ((UnicodeString *)((long)&compoundCompiled.compiledPattern.fUnion + 0x30));
        SimpleFormatter::format
                  ((SimpleFormatter *)local_78,
                   (UnicodeString *)((long)&compoundFormat.fUnion + 0x30),
                   (UnicodeString *)((long)&compoundCompiled.compiledPattern.fUnion + 0x30),
                   (UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_);
        UVar2 = ::U_FAILURE(*(UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_);
        if (UVar2 == '\0') {
          SimpleFormatter::SimpleFormatter
                    ((SimpleFormatter *)local_158,
                     (UnicodeString *)((long)&compoundCompiled.compiledPattern.fUnion + 0x30),0,1,
                     (UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_);
          UVar2 = ::U_FAILURE(*(UErrorCode *)trailCompiled.compiledPattern.fUnion._48_8_);
          if (UVar2 == '\0') {
            Modifier::Parameters::Parameters
                      (&local_1d8,&this->super_ModifierStore,'\0',leadFormat.fUnion._52_4_);
            SimpleModifier::SimpleModifier
                      (&local_1c8,(SimpleFormatter *)local_158,field,false,local_1d8);
            SimpleModifier::operator=
                      ((SimpleModifier *)
                       (&this->field_0x10 + (long)(int)leadFormat.fUnion._52_4_ * 0x70),&local_1c8);
            SimpleModifier::~SimpleModifier(&local_1c8);
          }
          bVar1 = UVar2 != '\0';
          SimpleFormatter::~SimpleFormatter((SimpleFormatter *)local_158);
        }
        else {
          bVar1 = true;
        }
        icu_63::UnicodeString::~UnicodeString
                  ((UnicodeString *)((long)&compoundCompiled.compiledPattern.fUnion + 0x30));
      }
      else {
        bVar1 = true;
      }
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&compoundFormat.fUnion + 0x30));
      if (bVar1) break;
    }
  }
  SimpleFormatter::~SimpleFormatter((SimpleFormatter *)local_78);
  return;
}

Assistant:

void LongNameHandler::multiSimpleFormatsToModifiers(const UnicodeString *leadFormats, UnicodeString trailFormat,
                                                    Field field, UErrorCode &status) {
    SimpleFormatter trailCompiled(trailFormat, 1, 1, status);
    if (U_FAILURE(status)) { return; }
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        StandardPlural::Form plural = static_cast<StandardPlural::Form>(i);
        UnicodeString leadFormat = getWithPlural(leadFormats, plural, status);
        if (U_FAILURE(status)) { return; }
        UnicodeString compoundFormat;
        trailCompiled.format(leadFormat, compoundFormat, status);
        if (U_FAILURE(status)) { return; }
        SimpleFormatter compoundCompiled(compoundFormat, 0, 1, status);
        if (U_FAILURE(status)) { return; }
        fModifiers[i] = SimpleModifier(compoundCompiled, field, false, {this, 0, plural});
    }
}